

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZDICT_getDictHeaderSize(void *dictBuffer,size_t dictSize)

{
  ZSTD_compressedBlockState_t *bs;
  void *workspace;
  size_t sVar1;
  
  sVar1 = 0xffffffffffffffe2;
  if ((8 < dictSize) && (*dictBuffer == -0x13cf5bc9)) {
    bs = (ZSTD_compressedBlockState_t *)malloc(0x1600);
    workspace = malloc(0x2200);
    sVar1 = 0xffffffffffffffc0;
    if (workspace != (void *)0x0 && bs != (ZSTD_compressedBlockState_t *)0x0) {
      bs->rep[0] = 1;
      bs->rep[1] = 4;
      bs->rep[2] = 8;
      (bs->entropy).huf.repeatMode = HUF_repeat_none;
      (bs->entropy).fse.offcode_repeatMode = FSE_repeat_none;
      (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
      (bs->entropy).fse.litlength_repeatMode = FSE_repeat_none;
      sVar1 = ZSTD_loadCEntropy(bs,workspace,dictBuffer,dictSize);
    }
    free(bs);
    free(workspace);
  }
  return sVar1;
}

Assistant:

size_t ZDICT_getDictHeaderSize(const void* dictBuffer, size_t dictSize)
{
    size_t headerSize;
    if (dictSize <= 8 || MEM_readLE32(dictBuffer) != ZSTD_MAGIC_DICTIONARY) return ERROR(dictionary_corrupted);

    {   ZSTD_compressedBlockState_t* bs = (ZSTD_compressedBlockState_t*)malloc(sizeof(ZSTD_compressedBlockState_t));
        U32* wksp = (U32*)malloc(HUF_WORKSPACE_SIZE);
        if (!bs || !wksp) {
            headerSize = ERROR(memory_allocation);
        } else {
            ZSTD_reset_compressedBlockState(bs);
            headerSize = ZSTD_loadCEntropy(bs, wksp, dictBuffer, dictSize);
        }

        free(bs);
        free(wksp);
    }

    return headerSize;
}